

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

void CollectHistogram_C(uint8_t *ref,uint8_t *pred,int start_block,int end_block,VP8Histogram *histo
                       )

{
  ushort uVar1;
  int iVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int distribution [32];
  int16_t out [16];
  int local_d8 [32];
  ushort local_58 [20];
  
  local_d8[0x1c] = 0;
  local_d8[0x1d] = 0;
  local_d8[0x1e] = 0;
  local_d8[0x1f] = 0;
  local_d8[0x18] = 0;
  local_d8[0x19] = 0;
  local_d8[0x1a] = 0;
  local_d8[0x1b] = 0;
  local_d8[0x14] = 0;
  local_d8[0x15] = 0;
  local_d8[0x16] = 0;
  local_d8[0x17] = 0;
  local_d8[0x10] = 0;
  local_d8[0x11] = 0;
  local_d8[0x12] = 0;
  local_d8[0x13] = 0;
  local_d8[0xc] = 0;
  local_d8[0xd] = 0;
  local_d8[0xe] = 0;
  local_d8[0xf] = 0;
  local_d8[8] = 0;
  local_d8[9] = 0;
  local_d8[10] = 0;
  local_d8[0xb] = 0;
  local_d8[4] = 0;
  local_d8[5] = 0;
  local_d8[6] = 0;
  local_d8[7] = 0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  local_d8[2] = 0;
  local_d8[3] = 0;
  if (start_block < end_block) {
    lVar9 = (long)start_block;
    do {
      (*VP8FTransform)(ref + VP8DspScan[lVar9],pred + VP8DspScan[lVar9],(int16_t *)local_58);
      lVar5 = 0;
      do {
        uVar1 = local_58[lVar5];
        uVar3 = -uVar1;
        if (0 < (short)uVar1) {
          uVar3 = uVar1;
        }
        uVar6 = (ulong)(uVar3 >> 3);
        if (0x1e < uVar3 >> 3) {
          uVar6 = 0x1f;
        }
        local_d8[uVar6] = local_d8[uVar6] + 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      lVar9 = lVar9 + 1;
    } while (lVar9 != end_block);
  }
  uVar6 = 1;
  uVar7 = 0;
  iVar8 = 0;
  do {
    iVar2 = local_d8[uVar7];
    iVar4 = iVar8;
    if (iVar8 < iVar2) {
      iVar4 = iVar2;
    }
    if (0 < iVar2) {
      uVar6 = uVar7 & 0xffffffff;
      iVar8 = iVar4;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  histo->max_value = iVar8;
  histo->last_non_zero = (int)uVar6;
  return;
}

Assistant:

static void CollectHistogram_C(const uint8_t* ref, const uint8_t* pred,
                               int start_block, int end_block,
                               VP8Histogram* const histo) {
  int j;
  int distribution[MAX_COEFF_THRESH + 1] = { 0 };
  for (j = start_block; j < end_block; ++j) {
    int k;
    int16_t out[16];

    VP8FTransform(ref + VP8DspScan[j], pred + VP8DspScan[j], out);

    // Convert coefficients to bin.
    for (k = 0; k < 16; ++k) {
      const int v = abs(out[k]) >> 3;
      const int clipped_value = clip_max(v, MAX_COEFF_THRESH);
      ++distribution[clipped_value];
    }
  }
  VP8SetHistogramData(distribution, histo);
}